

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerHeuristic.cpp
# Opt level: O3

void __thiscall Memory::RecyclerHeuristic::RecyclerHeuristic(RecyclerHeuristic *this)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  int iVar4;
  undefined4 *puVar5;
  uint uVar6;
  undefined8 uVar7;
  undefined1 local_58 [8];
  MEMORYSTATUSEX mem;
  
  local_58._0_4_ = 0x40;
  BVar3 = GlobalMemoryStatusEx((LPMEMORYSTATUSEX)local_58);
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerHeuristic.cpp"
                       ,0x1e,"(isSuccess)","isSuccess");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  else {
    bVar2 = AutoSystemInfo::IsLowMemoryDevice();
    if (bVar2 && (ulong)mem._0_8_ < 0x20000001) {
      uVar7 = 0x100000000020;
      iVar4 = 0x10;
      goto LAB_0072a3cb;
    }
    if ((ulong)mem._0_8_ < 0x40000001) {
      uVar7 = 0x400000000040;
      iVar4 = 0x40;
      goto LAB_0072a3cb;
    }
  }
  uVar7 = 0x2000000000100;
  iVar4 = 0xc0;
LAB_0072a3cb:
  this->DefaultMaxAllocPageCount = (int)uVar7;
  this->DefaultMaxFreePageCount = (int)((ulong)uVar7 >> 0x20);
  uVar6 = iVar4 * 0x100000;
  this->MaxUncollectedAllocBytes = uVar6;
  this->UncollectedAllocBytesConcurrentPriorityBoost = (ulong)uVar6;
  this->MaxPartialUncollectedNewPageCount = iVar4 << 8;
  this->MaxUncollectedAllocBytesOnExit = iVar4 << 0x13;
  this->MaxUncollectedAllocBytesPartialCollect = uVar6 - 0x100000;
  return;
}

Assistant:

RecyclerHeuristic::RecyclerHeuristic()
{
    ::MEMORYSTATUSEX mem;
    mem.dwLength = sizeof(mem);
    BOOL isSuccess = ::GlobalMemoryStatusEx(&mem);
    Assert(isSuccess);

    DWORDLONG physicalMemoryBytes = mem.ullTotalPhys;
    uint baseFactor;

    // xplat-todo: Android sysconf is rather unreliable,
    // ullTotalPhys may not be the best source for a decision below
    if (isSuccess && AutoSystemInfo::IsLowMemoryDevice() && physicalMemoryBytes <= 512 MEGABYTES)
    {
        // Low-end Apollo (512MB RAM) scenario.
        // Note that what's specific about Apollo is that IE runs in physical memory,
        //      that's one reason to distinguish 512MB Apollo from 512MB desktop.
        baseFactor = 16;
        this->DefaultMaxFreePageCount = 16 MEGABYTES_OF_PAGES;
        this->DefaultMaxAllocPageCount = 32;
    }
    else if (isSuccess && physicalMemoryBytes <= 1024 MEGABYTES)
    {
        // Tablet/slate/high-end Apollo scenario, including 512MB non-Apollo.
        baseFactor = 64;
        this->DefaultMaxFreePageCount = 64 MEGABYTES_OF_PAGES;
        this->DefaultMaxAllocPageCount = 64;
    }
    else
    {
        // Regular desktop scenario.
        baseFactor = 192;
        this->DefaultMaxFreePageCount = 512 MEGABYTES_OF_PAGES;
        this->DefaultMaxAllocPageCount = 256;
    }

    this->ConfigureBaseFactor(baseFactor);
}